

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluk.c
# Opt level: O3

int ffuintfi2(uint *input,long ntodo,double scale,double zero,short *output,int *status)

{
  long lVar1;
  short sVar2;
  uint uVar3;
  double dVar4;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    if (0 < ntodo) {
      lVar1 = 0;
      do {
        dVar4 = ((double)input[lVar1] - zero) / scale;
        if (-32768.49 <= dVar4) {
          if (dVar4 <= 32767.49) {
            if (0.0 <= dVar4) {
              dVar4 = dVar4 + 0.5;
            }
            else {
              dVar4 = dVar4 + -0.5;
            }
            sVar2 = (short)(int)dVar4;
          }
          else {
            *status = -0xb;
            sVar2 = 0x7fff;
          }
        }
        else {
          *status = -0xb;
          sVar2 = -0x8000;
        }
        output[lVar1] = sVar2;
        lVar1 = lVar1 + 1;
      } while (ntodo != lVar1);
    }
  }
  else if (0 < ntodo) {
    lVar1 = 0;
    do {
      uVar3 = input[lVar1];
      if (0x7fff < uVar3) {
        *status = -0xb;
        uVar3 = 0x7fff;
      }
      output[lVar1] = (short)uVar3;
      lVar1 = lVar1 + 1;
    } while (ntodo != lVar1);
  }
  return *status;
}

Assistant:

int ffuintfi2(unsigned int *input,  /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            short *output,     /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] > SHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MAX;
            }
            else
                output[ii] = input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DSHRT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MIN;
            }
            else if (dvalue > DSHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (short) (dvalue + .5);
                else
                    output[ii] = (short) (dvalue - .5);
            }
        }
    }
    return(*status);
}